

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  size_t __size;
  ulong uVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  BPMNode *pBVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  BPMNode *leaves;
  ulong uVar9;
  BPMNode *pBVar10;
  BPMNode **ppBVar11;
  BPMNode **ppBVar12;
  ulong uVar13;
  BPMNode *pBVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  BPMLists lists;
  BPMLists local_90;
  size_t local_58;
  uint *local_50;
  BPMNode *local_48;
  BPMNode *local_40;
  ulong local_38;
  
  if ((ulong)(uint)(1 << ((byte)maxbitlen & 0x1f)) <= numcodes - 1) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  if (numcodes == 0) {
    uVar18 = 0;
  }
  else {
    uVar9 = 0;
    uVar18 = 0;
    do {
      if (frequencies[uVar9] != 0) {
        leaves[uVar18].weight = frequencies[uVar9];
        leaves[uVar18].index = (uint)uVar9;
        uVar18 = uVar18 + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) != numcodes);
  }
  if (numcodes != 0) {
    uVar9 = 0;
    do {
      lengths[uVar9] = 0;
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) != numcodes);
  }
  if (uVar18 == 1) {
    uVar8 = leaves->index;
    lengths[uVar8] = 1;
    lengths[(ulong)uVar8 == 0] = 1;
  }
  else {
    if (uVar18 != 0) {
      __size = uVar18 * 0x18;
      local_50 = lengths;
      pBVar10 = (BPMNode *)malloc(__size);
      if (1 < uVar18) {
        uVar9 = 1;
        uVar16 = 0;
        do {
          local_38 = uVar16;
          pBVar14 = leaves;
          pBVar4 = pBVar10;
          if ((local_38 & 1) == 0) {
            pBVar14 = pBVar10;
            pBVar4 = leaves;
          }
          uVar2 = uVar9 * 2;
          uVar16 = 0;
          do {
            uVar20 = uVar16 + uVar9;
            if (uVar18 <= uVar16 + uVar9) {
              uVar20 = uVar18;
            }
            uVar15 = uVar16 + uVar2;
            pBVar5 = pBVar14;
            uVar17 = uVar16;
            uVar19 = uVar20;
            uVar21 = uVar18;
            if (uVar15 < uVar18) {
              uVar21 = uVar15;
            }
            for (; uVar16 < uVar21; uVar16 = uVar16 + 1) {
              if ((uVar17 < uVar20) &&
                 ((uVar21 <= uVar19 || (pBVar4[uVar17].weight <= pBVar4[uVar19].weight)))) {
                uVar13 = uVar17 + 1;
              }
              else {
                uVar13 = uVar17;
                uVar17 = uVar19;
                uVar19 = uVar19 + 1;
              }
              uVar6 = *(undefined4 *)&pBVar4[uVar17].field_0x14;
              pBVar5->in_use = pBVar4[uVar17].in_use;
              *(undefined4 *)&pBVar5->field_0x14 = uVar6;
              pBVar1 = pBVar4 + uVar17;
              uVar8 = pBVar1->index;
              pBVar3 = pBVar1->tail;
              pBVar5->weight = pBVar1->weight;
              pBVar5->index = uVar8;
              pBVar5->tail = pBVar3;
              pBVar5 = pBVar5 + 1;
              uVar17 = uVar13;
            }
            pBVar14 = pBVar14 + uVar9 * 2;
            uVar16 = uVar15;
          } while (uVar15 < uVar18);
          uVar9 = uVar2;
          uVar16 = local_38 + 1;
        } while (uVar2 < uVar18);
        local_58 = __size;
        local_48 = pBVar10;
        local_40 = leaves;
        if ((local_38 & 1) == 0) {
          memcpy(leaves,pBVar10,__size);
        }
      }
      free(pBVar10);
      local_90.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar9 = (ulong)local_90.memsize;
      local_90.nextfree = 0;
      local_90.numfree = local_90.memsize;
      local_90.listsize = maxbitlen;
      pBVar10 = (BPMNode *)malloc(uVar9 * 0x18);
      local_90.memory = pBVar10;
      ppBVar11 = (BPMNode **)malloc(uVar9 * 8);
      local_90.freelist = ppBVar11;
      ppBVar12 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_90.chains0 = ppBVar12;
      local_90.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      auVar22._0_4_ = -(uint)((int)((ulong)pBVar10 >> 0x20) == 0 && (int)pBVar10 == 0);
      auVar22._4_4_ = -(uint)((int)ppBVar11 == 0 && (int)((ulong)ppBVar11 >> 0x20) == 0);
      auVar22._8_4_ = -(uint)((int)((ulong)ppBVar12 >> 0x20) == 0 && (int)ppBVar12 == 0);
      auVar22._12_4_ =
           -(uint)((int)local_90.chains1 == 0 && (int)((ulong)local_90.chains1 >> 0x20) == 0);
      iVar7 = movmskps((int)local_90.chains1,auVar22);
      uVar8 = 0x53;
      if (iVar7 == 0) {
        if (local_90.memsize != 0) {
          uVar8 = 0;
          do {
            local_90.freelist[uVar8] = local_90.memory + uVar8;
            uVar8 = uVar8 + 1;
          } while (uVar8 != local_90.memsize);
        }
        uVar9 = 0;
        bpmnode_create(&local_90,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_90,leaves[1].weight,2,(BPMNode *)0x0);
        if (local_90.listsize != 0) {
          do {
            local_90.chains0[uVar9] = local_90.memory;
            local_90.chains1[uVar9] = local_90.memory + 1;
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
          } while (uVar8 != local_90.listsize);
        }
        uVar9 = uVar18 * 2 - 2;
        if (uVar9 != 2) {
          uVar16 = 2;
          do {
            boundaryPM(&local_90,leaves,uVar18,maxbitlen - 1,(int)uVar16);
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (uVar9 != uVar16);
        }
        for (pBVar10 = local_90.chains1[maxbitlen - 1]; uVar8 = 0, pBVar10 != (BPMNode *)0x0;
            pBVar10 = pBVar10->tail) {
          if (pBVar10->index != 0) {
            uVar18 = 0;
            do {
              local_50[leaves[uVar18].index] = local_50[leaves[uVar18].index] + 1;
              uVar8 = (int)uVar18 + 1;
              uVar18 = (ulong)uVar8;
            } while (uVar8 != pBVar10->index);
          }
        }
      }
      free(local_90.memory);
      free(local_90.freelist);
      free(local_90.chains0);
      free(local_90.chains1);
      goto LAB_0010bbc3;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar8 = 0;
LAB_0010bbc3:
  free(leaves);
  return uVar8;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
	size_t numcodes, unsigned maxbitlen)
{
	unsigned error = 0;
	unsigned i;
	size_t numpresent = 0; /*number of symbols with non-zero frequency*/
	BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

	if (numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
	if ((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

	leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
	if (!leaves) return 83; /*alloc fail*/

	for (i = 0; i != numcodes; ++i)
	{
		if (frequencies[i] > 0)
		{
			leaves[numpresent].weight = (int)frequencies[i];
			leaves[numpresent].index = i;
			++numpresent;
		}
	}

	for (i = 0; i != numcodes; ++i) lengths[i] = 0;

	/*ensure at least two present symbols. There should be at least one symbol
	according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
	make these work as well ensure there are at least two symbols. The
	Package-Merge code below also doesn't work correctly if there's only one
	symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
	if (numpresent == 0)
	{
		lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
	}
	else if (numpresent == 1)
	{
		lengths[leaves[0].index] = 1;
		lengths[leaves[0].index == 0 ? 1 : 0] = 1;
	}
	else
	{
		BPMLists lists;
		BPMNode* node;

		bpmnode_sort(leaves, numpresent);

		lists.listsize = maxbitlen;
		lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
		lists.nextfree = 0;
		lists.numfree = lists.memsize;
		lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
		lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
		lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
		lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
		if (!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

		if (!error)
		{
			for (i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

			bpmnode_create(&lists, leaves[0].weight, 1, 0);
			bpmnode_create(&lists, leaves[1].weight, 2, 0);

			for (i = 0; i != lists.listsize; ++i)
			{
				lists.chains0[i] = &lists.memory[0];
				lists.chains1[i] = &lists.memory[1];
			}

			/*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
			for (i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

			for (node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
			{
				for (i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
			}
		}

		lodepng_free(lists.memory);
		lodepng_free(lists.freelist);
		lodepng_free(lists.chains0);
		lodepng_free(lists.chains1);
	}

	lodepng_free(leaves);
	return error;
}